

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O0

double __thiscall HMatrix::compute_dot(HMatrix *this,HVector *vector,int iCol)

{
  double dVar1;
  const_reference pvVar2;
  reference pvVar3;
  const_reference pvVar4;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int k;
  double result;
  int local_24;
  double local_20;
  
  local_20 = 0.0;
  if (in_EDX < *in_RDI) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)in_EDX);
    for (local_24 = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(in_EDX + 1)),
        local_24 < *pvVar2; local_24 = local_24 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_24);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)*pvVar2);
      dVar1 = *pvVar3;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_24);
      local_20 = dVar1 * *pvVar4 + local_20;
    }
  }
  else {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),
                        (long)(in_EDX - *in_RDI));
    local_20 = *pvVar3;
  }
  return local_20;
}

Assistant:

double HMatrix::compute_dot(HVector& vector, int iCol) const {
    double result = 0;
    if (iCol < numCol) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
            result += vector.array[Aindex[k]] * Avalue[k];
    } else {
        result = vector.array[iCol - numCol];
    }
    return result;
}